

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O3

void __thiscall
pbrt::FunctionIntegrator::FunctionIntegrator
          (FunctionIntegrator *this,function<float_(pbrt::Point2<float>)> *func,
          string *outputFilename,CameraHandle *camera,SamplerHandle *sampler)

{
  pointer pcVar1;
  vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> local_58;
  PrimitiveHandle local_38;
  
  local_58.super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_38.
  super_TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
  .bits = (TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
           )0;
  local_58.super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  Integrator::Integrator(&this->super_Integrator,&local_38,&local_58);
  if (local_58.super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.
                    super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_58.
                          super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.
                          super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  (this->super_Integrator)._vptr_Integrator = (_func_int **)&PTR__FunctionIntegrator_02d9cde0;
  std::function<float_(pbrt::Point2<float>)>::function(&this->func,func);
  (this->outputFilename)._M_dataplus._M_p = (pointer)&(this->outputFilename).field_2;
  pcVar1 = (outputFilename->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->outputFilename,pcVar1,pcVar1 + outputFilename->_M_string_length);
  (this->camera).
  super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
  .bits = 0;
  (this->camera).
  super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
  .bits = (camera->
          super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
          ).bits;
  (this->baseSampler).
  super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
  .bits = 0;
  (this->baseSampler).
  super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
  .bits = (sampler->
          super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
          ).bits;
  return;
}

Assistant:

FunctionIntegrator::FunctionIntegrator(std::function<Float(Point2f)> func,
                                       const std::string &outputFilename,
                                       CameraHandle camera, SamplerHandle sampler)
    : Integrator(nullptr, {}),
      func(func),
      outputFilename(outputFilename),
      camera(camera),
      baseSampler(sampler) {}